

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backend.cpp
# Opt level: O2

void __thiscall backend::Backend::do_mir_to_arm_transform(Backend *this)

{
  optional<arm::ArmCode> *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  *extra_data;
  MirPackage *pMVar1;
  Backend *pBVar2;
  _Base_ptr p_Var3;
  ArmCode *pAVar4;
  Tag *in_RSI;
  Function *pFVar5;
  allocator<char> local_393;
  allocator<char> local_392;
  allocator<char> local_391;
  Backend *local_390;
  undefined1 local_388 [32];
  string local_368;
  undefined1 local_348 [8];
  _Alloc_hider local_340;
  _Base_ptr p_Stack_338;
  undefined1 local_330 [16];
  _Alloc_hider _Stack_320;
  _Base_ptr local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  size_t local_300;
  undefined **local_2f8;
  undefined8 local_2f0;
  undefined1 local_2e8;
  Function arm_f;
  Codegen cg;
  
  local_2f8 = (undefined **)CONCAT71(local_2f8._1_7_,2);
  local_390 = this;
  AixLog::operator<<((ostream *)&local_2f8,(Severity *)in_RSI);
  AixLog::Tag::Tag((Tag *)&arm_f);
  AixLog::operator<<((ostream *)&arm_f,in_RSI);
  local_368._M_string_length = std::chrono::_V2::system_clock::now();
  local_368._M_dataplus._M_p = (pointer)&PTR__Timestamp_001d8f28;
  local_368.field_2._M_local_buf[0] = '\0';
  AixLog::operator<<((ostream *)&local_368,(Timestamp *)in_RSI);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_348,"do_mir_to_arm_transform",&local_392);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_388,
             "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/backend.cpp"
             ,&local_393);
  pFVar5 = (Function *)local_348;
  AixLog::Function::Function((Function *)&cg,(string *)pFVar5,(string *)local_388,0x42);
  AixLog::operator<<((ostream *)&cg,pFVar5);
  std::operator<<((ostream *)&std::clog,"Doing  mir->arm  transform\n");
  AixLog::Function::~Function((Function *)&cg);
  std::__cxx11::string::~string((string *)local_388);
  std::__cxx11::string::~string((string *)local_348);
  AixLog::Tag::~Tag((Tag *)&arm_f);
  local_330._8_8_ = 0;
  _Stack_320._M_p = (pointer)0x0;
  local_348 = (undefined1  [8])&PTR_display_001dbb08;
  local_340._M_p = (pointer)0x0;
  p_Stack_338 = (_Base_ptr)0x0;
  local_330._0_8_ = 0;
  local_310._M_allocated_capacity = (size_type)&_Stack_320;
  local_318 = (_Base_ptr)0x0;
  local_300 = 0;
  pMVar1 = local_390->package;
  extra_data = &local_390->extra_data;
  local_310._8_8_ = local_310._M_allocated_capacity;
  for (p_Var3 = (pMVar1->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(pMVar1->functions)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    if (*(char *)&p_Var3[3]._M_parent[1]._M_left == '\0') {
      codegen::Codegen::Codegen
                (&cg,(MirFunction *)(p_Var3 + 2),local_390->package,extra_data,
                 local_390->options->allow_conditional_exec);
      codegen::Codegen::translate_function(&arm_f,&cg);
      std::make_unique<arm::Function,arm::Function>((Function *)local_388);
      std::
      vector<std::unique_ptr<arm::Function,std::default_delete<arm::Function>>,std::allocator<std::unique_ptr<arm::Function,std::default_delete<arm::Function>>>>
      ::emplace_back<std::unique_ptr<arm::Function,std::default_delete<arm::Function>>>
                ((vector<std::unique_ptr<arm::Function,std::default_delete<arm::Function>>,std::allocator<std::unique_ptr<arm::Function,std::default_delete<arm::Function>>>>
                  *)&local_340,
                 (unique_ptr<arm::Function,_std::default_delete<arm::Function>_> *)local_388);
      std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>::~unique_ptr
                ((unique_ptr<arm::Function,_std::default_delete<arm::Function>_> *)local_388);
      arm::Function::~Function(&arm_f);
      codegen::Codegen::~Codegen(&cg);
    }
  }
  pMVar1 = local_390->package;
  for (p_Var3 = (pMVar1->global_values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      pBVar2 = local_390,
      (_Rb_tree_header *)p_Var3 != &(pMVar1->global_values)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>
    ::pair<arm::ConstValue_&,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>
                *)&cg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (p_Var3 + 1),(ConstValue *)(p_Var3 + 2));
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,arm::ConstValue>,std::_Select1st<std::pair<std::__cxx11::string_const,arm::ConstValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,arm::ConstValue>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,arm::ConstValue>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,arm::ConstValue>,std::_Select1st<std::pair<std::__cxx11::string_const,arm::ConstValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,arm::ConstValue>>>
                *)(local_330 + 8),
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>
                *)&cg);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>
             *)&cg);
  }
  this_00 = &local_390->arm_code;
  pAVar4 = (ArmCode *)local_348;
  std::optional<arm::ArmCode>::emplace<arm::ArmCode>(this_00,pAVar4);
  if (pBVar2->options->show_code_after_each_pass != false) {
    local_392 = (allocator<char>)0x2;
    AixLog::operator<<((ostream *)&local_392,(Severity *)pAVar4);
    AixLog::Tag::Tag((Tag *)&arm_f);
    AixLog::operator<<((ostream *)&arm_f,(Tag *)pAVar4);
    local_2f0 = std::chrono::_V2::system_clock::now();
    local_2f8 = &PTR__Timestamp_001d8f28;
    local_2e8 = 0;
    AixLog::operator<<((ostream *)&local_2f8,(Timestamp *)pAVar4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_388,"do_mir_to_arm_transform",&local_393);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_368,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/backend.cpp"
               ,&local_391);
    pFVar5 = (Function *)local_388;
    AixLog::Function::Function((Function *)&cg,(string *)pFVar5,&local_368,0x50);
    AixLog::operator<<((ostream *)&cg,pFVar5);
    std::operator<<((ostream *)&std::clog,"Code after transformation\n");
    AixLog::Function::~Function((Function *)&cg);
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::string::~string((string *)local_388);
    AixLog::Tag::~Tag((Tag *)&arm_f);
    pAVar4 = std::optional<arm::ArmCode>::value(this_00);
    (**(pAVar4->super_Displayable)._vptr_Displayable)(pAVar4,&std::cout);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  arm::ArmCode::~ArmCode((ArmCode *)local_348);
  return;
}

Assistant:

void Backend::do_mir_to_arm_transform() {
  LOG(INFO) << ("Doing  mir->arm  transform\n");
  auto code = arm::ArmCode();
  for (auto& f : package.functions) {
    if (f.second.type->is_extern) continue;
    auto cg = codegen::Codegen(f.second, package, extra_data,
                               options.allow_conditional_exec);
    auto arm_f = cg.translate_function();
    code.functions.push_back(std::make_unique<arm::Function>(std::move(arm_f)));
  }
  for (auto& v : package.global_values) {
    code.consts.insert({v.first, v.second});
  }
  arm_code.emplace(std::move(code));
  if (options.show_code_after_each_pass) {
    LOG(INFO) << ("Code after transformation\n");
    std::cout << arm_code.value() << std::endl;
  }
}